

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxels.cpp
# Opt level: O3

FVoxel * R_LoadKVX(int lumpnum)

{
  long lVar1;
  undefined8 *puVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  undefined1 auVar6 [16];
  double dVar7;
  double dVar8;
  FVoxel *this;
  long lVar9;
  int *piVar10;
  BYTE **ppBVar11;
  double *pdVar12;
  uint uVar13;
  int *piVar14;
  uint uVar15;
  DWORD *pDVar16;
  int iVar17;
  ulong uVar18;
  BYTE *pBVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  LumpRecord *pLVar23;
  LumpRecord *pLVar24;
  int iVar25;
  uint uVar26;
  bool bVar27;
  double dVar28;
  FMemLump lump;
  kvxslab_t *slabs [5];
  FWadCollection local_88;
  
  this = (FVoxel *)operator_new(0x158);
  lVar9 = 0x28;
  do {
    *(undefined8 *)((long)this->Mips + lVar9 + -0x28) = 0;
    *(undefined4 *)((long)this->Mips + lVar9 + -0x20) = 0;
    puVar2 = (undefined8 *)((long)this->Mips + lVar9 + -0x18);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2 = (undefined8 *)((long)this->Mips + lVar9 + -8);
    *puVar2 = 0;
    puVar2[1] = 0;
    puVar2 = (undefined8 *)((long)&this->Mips[0].SizeZ + lVar9);
    *puVar2 = 0;
    puVar2[1] = 0;
    lVar9 = lVar9 + 0x40;
  } while (lVar9 != 0x168);
  this->Palette = (BYTE *)0x0;
  FWadCollection::ReadLump(&local_88,0x1c70340);
  pLVar24 = (LumpRecord *)((long)local_88.Files.Array + -0x10);
  local_88.Files._8_8_ = ZEXT48(*(uint *)&pLVar24->field_0x4);
  if (local_88.Files._8_8_ == 0) {
    local_88.Files.Array = (FResourceFile **)0x0;
  }
  iVar17 = *(uint *)&pLVar24->field_0x4 - 0x305;
  lVar9 = 0;
  pLVar24 = (LumpRecord *)local_88.Files.Array;
  local_88.LumpInfo.Array = (LumpRecord *)local_88.Files.Array;
  do {
    uVar13 = pLVar24->wadnum;
    pLVar23 = pLVar24;
    if ((iVar17 < (int)uVar13) || ((int)uVar13 < 0x18)) {
LAB_005154d7:
      if (lVar9 == 0) goto LAB_005154fd;
      goto LAB_005154df;
    }
    pLVar23 = (LumpRecord *)&pLVar24->field_0x4;
    iVar4 = *(int *)&pLVar24->field_0x4;
    this->Mips[lVar9].SizeX = iVar4;
    uVar5 = *(uint *)&pLVar24->lump;
    this->Mips[lVar9].SizeY = uVar5;
    this->Mips[lVar9].SizeZ = *(int *)((long)&pLVar24->lump + 4);
    this->Mips[lVar9].Pivot.X = (double)pLVar24[1].wadnum * 0.00390625;
    this->Mips[lVar9].Pivot.Y = (double)*(int *)&pLVar24[1].field_0x4 * 0.00390625;
    this->Mips[lVar9].Pivot.Z = (double)*(int *)&pLVar24[1].lump * 0.00390625;
    uVar15 = (uVar5 + 1) * iVar4;
    iVar25 = uVar15 * 2 + iVar4 * 4 + 4;
    uVar26 = (uVar13 - 0x18) - iVar25;
    if ((int)uVar26 < 0) goto LAB_005154d7;
    uVar18 = (ulong)uVar13;
    if (uVar13 - 0x18 != iVar25) {
      local_88.LumpInfo._8_8_ = (ulong)uVar13;
      local_88.FirstLumpIndex = (DWORD *)(this->Mips + lVar9);
      local_88.NextLumpIndex = (DWORD *)(long)iVar4;
      piVar10 = (int *)operator_new__((ulong)(uVar13 - 0x15 & 0xfffffffc));
      *(int **)((long)local_88.FirstLumpIndex + 0x28) = piVar10;
      piVar14 = piVar10 + (long)local_88.NextLumpIndex + 1;
      *(int **)((long)local_88.FirstLumpIndex + 0x30) = piVar14;
      *(BYTE **)((long)local_88.FirstLumpIndex + 0x38) =
           (BYTE *)((long)(piVar10 + (long)local_88.NextLumpIndex) + (long)(int)uVar15 * 2 + 4);
      if ((int)local_88.NextLumpIndex < 0) {
        uVar18 = 0;
      }
      else {
        lVar1 = ((ulong)local_88.NextLumpIndex & 0xffffffff) + 1;
        lVar20 = 0;
        do {
          piVar10[lVar20] = *(int *)((long)&pLVar24[1].lump + lVar20 * 4 + 4) - iVar25;
          lVar20 = lVar20 + 1;
        } while (lVar1 != lVar20);
        if (*piVar10 != 0) goto LAB_005154d7;
        uVar18 = (ulong)(uint)((int)lVar1 * 4);
      }
      if (piVar10[(long)local_88.NextLumpIndex] != uVar26) goto LAB_005154d7;
      if (0 < (int)uVar15) {
        uVar21 = 0;
        do {
          *(undefined2 *)((long)piVar14 + uVar21 * 2) =
               *(undefined2 *)((long)&pLVar24[1].lump + uVar21 * 2 + uVar18 + 4);
          uVar21 = uVar21 + 1;
        } while (uVar15 != uVar21);
      }
      if (0 < (int)local_88.NextLumpIndex) {
        uVar18 = 0;
        do {
          if (0 < (int)uVar5) {
            uVar21 = 0;
            do {
              if (uVar26 < (uint)((int)*(short *)((long)piVar14 + uVar21 * 2) + piVar10[uVar18]))
              goto LAB_005154fd;
              uVar21 = uVar21 + 1;
            } while (uVar5 != uVar21);
          }
          uVar18 = uVar18 + 1;
          piVar14 = (int *)((long)piVar14 + (ulong)(uVar5 + 1) * 2);
        } while (uVar18 != ((ulong)local_88.NextLumpIndex & 0xffffffff));
      }
      (&local_88.FirstLumpIndex_FullName)[lVar9] =
           (DWORD *)((long)&pLVar24[1].lump + (long)iVar25 + 4);
      uVar18 = local_88.LumpInfo._8_8_;
    }
    pLVar23 = (LumpRecord *)((long)pLVar23 + uVar18);
    iVar17 = (iVar17 - (int)uVar18) + -4;
    lVar9 = lVar9 + 1;
    pLVar24 = pLVar23;
  } while (lVar9 != 5);
  lVar9 = 5;
LAB_005154df:
  pLVar24 = (LumpRecord *)
            ((long)&local_88.LumpInfo.Array[-0x30].wadnum + (long)(local_88.Files.Most + -1));
  if (pLVar23 == pLVar24) {
    uVar18 = lVar9 + 1;
    ppBVar11 = &this->Mips[lVar9 + -1].SlabData;
    do {
      uVar18 = uVar18 - 1;
      if ((long)uVar18 < 1) {
        this->NumMips = 0;
        goto LAB_0051562e;
      }
      pBVar19 = *ppBVar11;
      ppBVar11 = ppBVar11 + -8;
    } while (pBVar19 == (BYTE *)0x0);
    this->NumMips = (int)uVar18;
    if (uVar18 != 1) {
      dVar7 = this->Mips[0].Pivot.X;
      dVar8 = this->Mips[0].Pivot.Y;
      dVar28 = this->Mips[0].Pivot.Z;
      pdVar12 = &this->Mips[1].Pivot.Z;
      lVar9 = (uVar18 & 0xffffffff) - 1;
      do {
        dVar7 = dVar7 * 0.5;
        dVar8 = dVar8 * 0.5;
        dVar28 = dVar28 * 0.5;
        *pdVar12 = dVar28;
        auVar6._8_4_ = SUB84(dVar8,0);
        auVar6._0_8_ = dVar7;
        auVar6._12_4_ = (int)((ulong)dVar8 >> 0x20);
        ((DVector3 *)(pdVar12 + -2))->X = dVar7;
        ((DVector3 *)(pdVar12 + -2))->Y = (double)auVar6._8_8_;
        pdVar12 = pdVar12 + 8;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    uVar21 = 0;
    do {
      uVar13 = this->Mips[uVar21].OffsetX[this->Mips[uVar21].SizeX];
      if (2 < (int)uVar13) {
        pDVar16 = (&local_88.FirstLumpIndex_FullName)[uVar21];
        pBVar19 = this->Mips[uVar21].SlabData;
        do {
          bVar3 = *(byte *)((long)pDVar16 + 1);
          lVar9 = (ulong)bVar3 + 3;
          bVar27 = uVar13 < (uint)lVar9;
          uVar13 = uVar13 - (uint)lVar9;
          if (bVar27) goto LAB_005154fd;
          *pBVar19 = (BYTE)*pDVar16;
          pBVar19[1] = bVar3;
          pBVar19[2] = *(BYTE *)((long)pDVar16 + 2);
          if (bVar3 != 0) {
            uVar22 = 0;
            do {
              pBVar19[uVar22 + 3] = *(BYTE *)((long)pDVar16 + uVar22 + 3);
              uVar22 = uVar22 + 1;
            } while (bVar3 != uVar22);
          }
          pDVar16 = (DWORD *)((long)pDVar16 + lVar9);
          pBVar19 = pBVar19 + lVar9;
        } while (2 < (int)uVar13);
      }
      uVar21 = uVar21 + 1;
    } while (uVar21 != (uVar18 & 0xffffffff));
LAB_0051562e:
    this->LumpNum = lumpnum;
    pBVar19 = (BYTE *)operator_new__(0x300);
    this->Palette = pBVar19;
    memcpy(pBVar19,pLVar24,0x300);
  }
  else {
LAB_005154fd:
    FVoxel::~FVoxel(this);
    operator_delete(this,0x158);
    this = (FVoxel *)0x0;
  }
  FMemLump::~FMemLump((FMemLump *)&local_88);
  return this;
}

Assistant:

FVoxel *R_LoadKVX(int lumpnum)
{
	const kvxslab_t *slabs[MAXVOXMIPS];
	FVoxel *voxel = new FVoxel;
	const BYTE *rawmip;
	int mip, maxmipsize;
	int i, j, n;

	FMemLump lump = Wads.ReadLump(lumpnum);	// FMemLump adds an extra 0 byte to the end.
	BYTE *rawvoxel = (BYTE *)lump.GetMem();
	int voxelsize = (int)(lump.GetSize()-1);

	// Oh, KVX, why couldn't you have a proper header? We'll just go through
	// and collect each MIP level, doing lots of range checking, and if the
	// last one doesn't end exactly 768 bytes before the end of the file,
	// we'll reject it.

	for (mip = 0, rawmip = rawvoxel, maxmipsize = voxelsize - 768 - 4;
		 mip < MAXVOXMIPS;
		 mip++)
	{
		int numbytes = GetInt(rawmip);
		if (numbytes > maxmipsize || numbytes < 24)
		{
			break;
		}
		rawmip += 4;

		FVoxelMipLevel *mipl = &voxel->Mips[mip];

		// Load header data.
		mipl->SizeX = GetInt(rawmip + 0);
		mipl->SizeY = GetInt(rawmip + 4);
		mipl->SizeZ = GetInt(rawmip + 8);
		mipl->Pivot.X = GetInt(rawmip + 12) / 256.;
		mipl->Pivot.Y = GetInt(rawmip + 16) / 256.;
		mipl->Pivot.Z = GetInt(rawmip + 20) / 256.;

		// How much space do we have for voxdata?
		int offsetsize = (mipl->SizeX + 1) * 4 + mipl->SizeX * (mipl->SizeY + 1) * 2;
		int voxdatasize = numbytes - 24 - offsetsize;
		if (voxdatasize < 0)
		{ // Clearly, not enough.
			break;
		}
		if (voxdatasize != 0)
		{	// This mip level is not empty.
			// Allocate slab data space.
			mipl->OffsetX = new int[(numbytes - 24 + 3) / 4];
			mipl->OffsetXY = (short *)(mipl->OffsetX + mipl->SizeX + 1);
			mipl->SlabData = (BYTE *)(mipl->OffsetXY + mipl->SizeX * (mipl->SizeY + 1));

			// Load x offsets.
			for (i = 0, n = mipl->SizeX; i <= n; ++i)
			{
				// The X offsets stored in the KVX file are relative to the start of the
				// X offsets array. Make them relative to voxdata instead.
				mipl->OffsetX[i] = GetInt(rawmip + 24 + i * 4) - offsetsize;
			}

			// The first X offset must be 0 (since we subtracted offsetsize), according to the spec:
			//		NOTE: xoffset[0] = (xsiz+1)*4 + xsiz*(ysiz+1)*2 (ALWAYS)
			if (mipl->OffsetX[0] != 0)
			{
				break;
			}
			// And the final X offset must point just past the end of the voxdata.
			if (mipl->OffsetX[mipl->SizeX] != voxdatasize)
			{
				break;
			}

			// Load xy offsets.
			i = 24 + i * 4;
			for (j = 0, n *= mipl->SizeY + 1; j < n; ++j)
			{
				mipl->OffsetXY[j] = GetShort(rawmip + i + j * 2);
			}

			// Ensure all offsets are within bounds.
			for (i = 0; i < mipl->SizeX; ++i)
			{
				int xoff = mipl->OffsetX[i];
				for (j = 0; j < mipl->SizeY; ++j)
				{
					int yoff = mipl->OffsetXY[(mipl->SizeY + 1) * i + j];
					if (unsigned(xoff + yoff) > unsigned(voxdatasize))
					{
						delete voxel;
						return NULL;
					}
				}
			}

			// Record slab location for the end.
			slabs[mip] = (kvxslab_t *)(rawmip + 24 + offsetsize);
		}

		// Time for the next mip Level.
		rawmip += numbytes;
		maxmipsize -= numbytes + 4;
	}